

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_cadd_bit(secp256k1_scalar *r,uint bit,int flag)

{
  uint64_t *puVar1;
  undefined1 *puVar2;
  secp256k1_fe *r_00;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  secp256k1_fe *in_RCX;
  secp256k1_fe *psVar13;
  uint uVar14;
  secp256k1_fe *extraout_RDX;
  secp256k1_fe *extraout_RDX_00;
  ulong uVar15;
  secp256k1_fe *a;
  secp256k1_scalar *psVar16;
  undefined1 *puVar17;
  undefined4 in_register_00000034;
  secp256k1_ge *a_00;
  secp256k1_gej *a_01;
  secp256k1_scalar *psVar18;
  ulong uVar19;
  ulong uVar20;
  secp256k1_gej *r_01;
  secp256k1_gej *in_R8;
  long lVar21;
  secp256k1_ge *psVar22;
  bool bVar23;
  int vflag;
  secp256k1_gej sStack_2b8;
  secp256k1_scalar *psStack_220;
  secp256k1_gej sStack_1e0;
  secp256k1_gej sStack_148;
  secp256k1_ge sStack_b0;
  secp256k1_scalar *psStack_48;
  
  a_00 = (secp256k1_ge *)CONCAT44(in_register_00000034,bit);
  psVar13 = (secp256k1_fe *)(ulong)bit;
  psVar18 = r;
  secp256k1_scalar_verify(r);
  if (bit < 0x100) {
    uVar12 = flag - 1U & 0x100 | bit;
    uVar14 = uVar12 >> 6;
    bVar11 = (byte)bit;
    uVar10 = (ulong)(uVar12 < 0x40) << (bVar11 & 0x3f);
    a_00 = (secp256k1_ge *)((ulong)(uVar14 == 1) << (bVar11 & 0x3f));
    uVar19 = (ulong)(uVar14 == 2) << (bVar11 & 0x3f);
    in_R8 = (secp256k1_gej *)((ulong)(uVar14 == 3) << (bVar11 & 0x3f));
    uVar3 = r->d[0];
    r->d[0] = r->d[0] + uVar10;
    puVar1 = r->d + 1;
    uVar10 = (ulong)CARRY8(uVar3,uVar10);
    uVar3 = *puVar1;
    uVar15 = (long)(a_00->x).n + *puVar1;
    *puVar1 = uVar15 + uVar10;
    puVar1 = r->d + 2;
    uVar10 = (ulong)(CARRY8(uVar3,(ulong)a_00) || CARRY8(uVar15,uVar10));
    uVar3 = *puVar1;
    uVar15 = *puVar1 + uVar19;
    *puVar1 = uVar15 + uVar10;
    puVar1 = r->d + 3;
    uVar3 = (ulong)(CARRY8(uVar3,uVar19) || CARRY8(uVar15,uVar10));
    bVar23 = CARRY8(*puVar1,(ulong)in_R8);
    uVar10 = (long)(in_R8->x).n + *puVar1;
    *puVar1 = uVar10 + uVar3;
    psVar18 = r;
    secp256k1_scalar_verify(r);
    in_RCX = psVar13;
    if (!bVar23 && !CARRY8(uVar10,uVar3)) {
      return;
    }
  }
  else {
    secp256k1_scalar_cadd_bit_cold_2();
  }
  secp256k1_scalar_cadd_bit_cold_1();
  psStack_48 = r;
  if (in_R8->infinity == 0) {
    secp256k1_gej_double_var(&sStack_148,in_R8,(secp256k1_fe *)0x0);
    secp256k1_ge_set_xy(&sStack_b0,&sStack_148.x,&sStack_148.y);
    secp256k1_ge_set_gej_zinv(a_00,in_R8,&sStack_148.z);
    secp256k1_gej_set_ge(&sStack_1e0,a_00);
    sStack_1e0.z.n[0] = (in_R8->z).n[0];
    sStack_1e0.z.n[1] = (in_R8->z).n[1];
    sStack_1e0.z.n[2] = (in_R8->z).n[2];
    sStack_1e0.z.n[3] = (in_R8->z).n[3];
    sStack_1e0.z.n[4] = (in_R8->z).n[4];
    sStack_1e0.z.magnitude = (in_R8->z).magnitude;
    sStack_1e0.z.normalized = (in_R8->z).normalized;
    extraout_RDX->n[4] = sStack_148.z.n[4];
    extraout_RDX->magnitude = sStack_148.z.magnitude;
    extraout_RDX->normalized = sStack_148.z.normalized;
    extraout_RDX->n[2] = sStack_148.z.n[2];
    extraout_RDX->n[3] = sStack_148.z.n[3];
    extraout_RDX->n[0] = sStack_148.z.n[0];
    extraout_RDX->n[1] = sStack_148.z.n[1];
    if (1 < (int)psVar18) {
      lVar21 = ((ulong)psVar18 & 0xffffffff) - 1;
      psVar13 = extraout_RDX;
      do {
        a_00 = a_00 + 1;
        psVar13 = psVar13 + 1;
        secp256k1_gej_add_ge_var(&sStack_1e0,&sStack_1e0,&sStack_b0,psVar13);
        secp256k1_ge_set_xy(a_00,&sStack_1e0.x,&sStack_1e0.y);
        lVar21 = lVar21 + -1;
      } while (lVar21 != 0);
    }
    secp256k1_fe_mul(in_RCX,&sStack_1e0.z,&sStack_148.z);
    return;
  }
  secp256k1_ecmult_odd_multiples_table_cold_1();
  psVar16 = psVar18;
  psVar22 = a_00;
  psVar13 = extraout_RDX_00;
  psStack_220 = r;
  if (psVar18 != (secp256k1_scalar *)0x0) {
    do {
      secp256k1_ge_verify(psVar22);
      secp256k1_fe_verify(psVar13);
      psVar13 = psVar13 + 1;
      psVar16 = (secp256k1_scalar *)((long)psVar16[-1].d + 0x1f);
      psVar22 = psVar22 + 1;
    } while (psVar16 != (secp256k1_scalar *)0x0);
    puVar2 = (undefined1 *)((long)psVar18[-1].d + 0x1f);
    psVar13 = &a_00[(long)puVar2].y;
    secp256k1_fe_verify(psVar13);
    uVar3 = a_00[(long)puVar2].y.n[4];
    uVar15 = (uVar3 >> 0x30) * 0x1000003d1 + psVar13->n[0];
    uVar10 = (uVar15 >> 0x34) + a_00[(long)puVar2].y.n[1];
    uVar19 = (uVar10 >> 0x34) + a_00[(long)puVar2].y.n[2];
    uVar20 = (uVar19 >> 0x34) + a_00[(long)puVar2].y.n[3];
    a_01 = (secp256k1_gej *)(uVar19 & 0xfffffffffffff);
    psVar13->n[0] = uVar15 & 0xfffffffffffff;
    a_00[(long)puVar2].y.n[1] = uVar10 & 0xfffffffffffff;
    a_00[(long)puVar2].y.n[2] = (uint64_t)a_01;
    a_00[(long)puVar2].y.n[3] = uVar20 & 0xfffffffffffff;
    a_00[(long)puVar2].y.n[4] = (uVar20 >> 0x34) + (uVar3 & 0xffffffffffff);
    a_00[(long)puVar2].y.magnitude = 1;
    secp256k1_fe_verify(psVar13);
    sStack_2b8.x.n[0] = extraout_RDX_00[(long)puVar2].n[0];
    sStack_2b8.x.n[1] = extraout_RDX_00[(long)puVar2].n[1];
    sStack_2b8.x.n[2] = extraout_RDX_00[(long)puVar2].n[2];
    sStack_2b8.x.n[3] = (extraout_RDX_00[(long)puVar2].n + 2)[1];
    sStack_2b8.x.n[4] = extraout_RDX_00[(long)puVar2].n[4];
    sStack_2b8.x._40_8_ = (extraout_RDX_00[(long)puVar2].n + 4)[1];
    if (puVar2 != (undefined1 *)0x0) {
      psVar22 = a_00 + (long)((long)psVar18[-1].d + 0x1e);
      psVar13 = extraout_RDX_00 + (long)psVar18;
      puVar17 = (undefined1 *)0x0;
      do {
        psVar13 = psVar13 + -1;
        if (puVar17 != (undefined1 *)0x0) {
          a_01 = &sStack_2b8;
          secp256k1_fe_mul(&sStack_2b8.x,&sStack_2b8.x,psVar13);
        }
        secp256k1_ge_verify(psVar22);
        r_01 = &sStack_2b8;
        secp256k1_fe_verify(&sStack_2b8.x);
        if (psVar22->infinity != 0) {
          secp256k1_ge_table_set_globalz_cold_1();
          secp256k1_gej_verify(a_01);
          if (a_01->infinity == 0) {
            if (a != (secp256k1_fe *)0x0) {
              uVar4 = (a_01->y).n[0];
              uVar5 = (a_01->y).n[1];
              uVar6 = (a_01->y).n[2];
              uVar7 = (a_01->y).n[3];
              iVar8 = (a_01->y).magnitude;
              iVar9 = (a_01->y).normalized;
              a->n[4] = (a_01->y).n[4];
              a->magnitude = iVar8;
              a->normalized = iVar9;
              a->n[2] = uVar6;
              a->n[3] = uVar7;
              a->n[0] = uVar4;
              a->n[1] = uVar5;
              secp256k1_fe_verify(a);
              uVar3 = a->n[4];
              uVar15 = (uVar3 >> 0x30) * 0x1000003d1 + a->n[0];
              uVar10 = (uVar15 >> 0x34) + a->n[1];
              uVar19 = (uVar10 >> 0x34) + a->n[2];
              uVar20 = (uVar19 >> 0x34) + a->n[3];
              a->n[0] = uVar15 & 0xfffffffffffff;
              a->n[1] = uVar10 & 0xfffffffffffff;
              a->n[2] = uVar19 & 0xfffffffffffff;
              a->n[3] = uVar20 & 0xfffffffffffff;
              a->n[4] = (uVar20 >> 0x34) + (uVar3 & 0xffffffffffff);
              a->magnitude = 1;
              secp256k1_fe_verify(a);
            }
            secp256k1_gej_double(r_01,a_01);
            secp256k1_gej_verify(r_01);
            return;
          }
          secp256k1_gej_set_infinity(r_01);
          if (a == (secp256k1_fe *)0x0) {
            return;
          }
          a->n[0] = 1;
          a->n[1] = 0;
          a->n[2] = 0;
          a->n[3] = 0;
          a->n[4] = 0;
          a->magnitude = 1;
          a->normalized = 1;
          secp256k1_fe_verify(a);
          return;
        }
        r_00 = (secp256k1_fe *)(sStack_2b8.z.n + 1);
        secp256k1_fe_sqr(r_00,&sStack_2b8.x);
        secp256k1_fe_mul((secp256k1_fe *)(sStack_2b8.y.n + 1),r_00,&sStack_2b8.x);
        secp256k1_fe_mul(&psVar22->x,&psVar22->x,r_00);
        a_01 = (secp256k1_gej *)&psVar22->y;
        secp256k1_fe_mul((secp256k1_fe *)a_01,(secp256k1_fe *)a_01,
                         (secp256k1_fe *)(sStack_2b8.y.n + 1));
        secp256k1_ge_verify(psVar22);
        puVar17 = puVar17 + 1;
        psVar22 = psVar22 + -1;
      } while (puVar2 != puVar17);
    }
    do {
      secp256k1_ge_verify(a_00);
      a_00 = a_00 + 1;
      psVar18 = (secp256k1_scalar *)((long)psVar18[-1].d + 0x1f);
    } while (psVar18 != (secp256k1_scalar *)0x0);
  }
  return;
}

Assistant:

static void secp256k1_scalar_cadd_bit(secp256k1_scalar *r, unsigned int bit, int flag) {
    secp256k1_uint128 t;
    volatile int vflag = flag;
    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(bit < 256);

    bit += ((uint32_t) vflag - 1) & 0x100;  /* forcing (bit >> 6) > 3 makes this a noop */
    secp256k1_u128_from_u64(&t, r->d[0]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 0)) << (bit & 0x3F));
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 1)) << (bit & 0x3F));
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 2)) << (bit & 0x3F));
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 3)) << (bit & 0x3F));
    r->d[3] = secp256k1_u128_to_u64(&t);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_u128_hi_u64(&t) == 0);
}